

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluent_builder.cpp
# Opt level: O2

string * __thiscall
HtmlElement::str_abi_cxx11_(string *__return_storage_ptr__,HtmlElement *this,int indent_size)

{
  pointer pHVar1;
  ostream *poVar2;
  HtmlElement *e;
  pointer this_00;
  string local_1e8;
  string indent_str;
  ostringstream out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  indent_str._M_dataplus._M_p = (pointer)&indent_str.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent_str,(char)indent_size);
  poVar2 = std::operator<<((ostream *)&out,(string *)&indent_str);
  poVar2 = std::operator<<(poVar2,"<");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((this->contents)._M_string_length != 0) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)indent_size * '\x02');
    poVar2 = std::operator<<((ostream *)&out,(string *)&local_1e8);
    poVar2 = std::operator<<(poVar2,(string *)&this->contents);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  pHVar1 = (this->children).super__Vector_base<HtmlElement,_std::allocator<HtmlElement>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->children).super__Vector_base<HtmlElement,_std::allocator<HtmlElement>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pHVar1; this_00 = this_00 + 1)
  {
    str_abi_cxx11_(&local_1e8,this_00,2);
    std::operator<<((ostream *)&out,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  poVar2 = std::operator<<((ostream *)&out,(string *)&indent_str);
  poVar2 = std::operator<<(poVar2,"</");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&indent_str);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string str(int indent_size = 0) const
	{
		std::ostringstream out;
		std::string indent_str(indent_size * base_indent, ' ');
		out << indent_str << "<" << tag_name << ">" << std::endl;;

		if(!contents.empty())
		{
			out << std::string(indent_size * (base_indent + 1), ' ') << contents << std::endl;;
		}

		for(const auto& e : children)
		{
			out << e.str(base_indent + 1);
		}

		out << indent_str << "</" << tag_name << ">" << std::endl;;
		return out.str();
	}